

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.h
# Opt level: O2

void __thiscall HighsLpRelaxation::storeBasis(HighsLpRelaxation *this)

{
  undefined1 local_20 [16];
  
  if ((this->currentbasisstored == false) && ((this->lpsolver).basis_.valid == true)) {
    std::make_shared<HighsBasis,HighsBasis_const&>((HighsBasis *)local_20);
    std::__shared_ptr<HighsBasis_const,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<HighsBasis_const,(__gnu_cxx::_Lock_policy)2> *)&this->basischeckpoint,
               (__shared_ptr<HighsBasis,_(__gnu_cxx::_Lock_policy)2> *)local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_20 + 8));
    this->currentbasisstored = true;
  }
  return;
}

Assistant:

void storeBasis() {
    if (!currentbasisstored && lpsolver.getBasis().valid) {
      basischeckpoint = std::make_shared<HighsBasis>(lpsolver.getBasis());
      currentbasisstored = true;
    }
  }